

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlC14NDocDumpMemory(void)

{
  int iVar1;
  int iVar2;
  int val;
  int val_00;
  xmlDocPtr val_01;
  xmlNodeSetPtr val_02;
  xmlChar **val_03;
  xmlChar **val_04;
  int local_64;
  int n_doc_txt_ptr;
  xmlChar **doc_txt_ptr;
  int n_with_comments;
  int with_comments;
  int n_inclusive_ns_prefixes;
  xmlChar **inclusive_ns_prefixes;
  int n_mode;
  int mode;
  int n_nodes;
  xmlNodeSetPtr nodes;
  int n_doc;
  xmlDocPtr doc;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (nodes._4_4_ = 0; (int)nodes._4_4_ < 4; nodes._4_4_ = nodes._4_4_ + 1) {
    for (n_mode = 0; n_mode < 1; n_mode = n_mode + 1) {
      for (inclusive_ns_prefixes._4_4_ = 0; (int)inclusive_ns_prefixes._4_4_ < 4;
          inclusive_ns_prefixes._4_4_ = inclusive_ns_prefixes._4_4_ + 1) {
        for (n_with_comments = 0; n_with_comments < 1; n_with_comments = n_with_comments + 1) {
          for (doc_txt_ptr._4_4_ = 0; (int)doc_txt_ptr._4_4_ < 4;
              doc_txt_ptr._4_4_ = doc_txt_ptr._4_4_ + 1) {
            for (local_64 = 0; local_64 < 1; local_64 = local_64 + 1) {
              iVar1 = xmlMemBlocks();
              val_01 = gen_xmlDocPtr(nodes._4_4_,0);
              val_02 = gen_xmlNodeSetPtr(n_mode,1);
              iVar2 = gen_int(inclusive_ns_prefixes._4_4_,2);
              val_03 = gen_xmlChar_ptr_ptr(n_with_comments,3);
              val = gen_int(doc_txt_ptr._4_4_,4);
              val_04 = gen_xmlChar_ptr_ptr(local_64,5);
              val_00 = xmlC14NDocDumpMemory(val_01,val_02,iVar2,val_03,val,val_04);
              desret_int(val_00);
              call_tests = call_tests + 1;
              des_xmlDocPtr(nodes._4_4_,val_01,0);
              des_xmlNodeSetPtr(n_mode,val_02,1);
              des_int(inclusive_ns_prefixes._4_4_,iVar2,2);
              des_xmlChar_ptr_ptr(n_with_comments,val_03,3);
              des_int(doc_txt_ptr._4_4_,val,4);
              des_xmlChar_ptr_ptr(local_64,val_04,5);
              xmlResetLastError();
              iVar2 = xmlMemBlocks();
              if (iVar1 != iVar2) {
                iVar2 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlC14NDocDumpMemory",
                       (ulong)(uint)(iVar2 - iVar1));
                ret_val = ret_val + 1;
                printf(" %d",(ulong)nodes._4_4_);
                printf(" %d",(ulong)(uint)n_mode);
                printf(" %d",(ulong)inclusive_ns_prefixes._4_4_);
                printf(" %d",(ulong)(uint)n_with_comments);
                printf(" %d",(ulong)doc_txt_ptr._4_4_);
                printf(" %d");
                printf("\n");
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlC14NDocDumpMemory(void) {
    int test_ret = 0;

#if defined(LIBXML_C14N_ENABLED) && defined(LIBXML_OUTPUT_ENABLED)
    int mem_base;
    int ret_val;
    xmlDocPtr doc; /* the XML document for canonization */
    int n_doc;
    xmlNodeSetPtr nodes; /* the nodes set to be included in the canonized image or NULL if all document nodes should be included */
    int n_nodes;
    int mode; /* the c14n mode (see @xmlC14NMode) */
    int n_mode;
    xmlChar ** inclusive_ns_prefixes; /* the list of inclusive namespace prefixes ended with a NULL or NULL if there is no inclusive namespaces (only for exclusive canonicalization, ignored otherwise) */
    int n_inclusive_ns_prefixes;
    int with_comments; /* include comments in the result (!=0) or not (==0) */
    int n_with_comments;
    xmlChar ** doc_txt_ptr; /* the memory pointer for allocated canonical XML text; the caller of this functions is responsible for calling xmlFree() to free allocated memory */
    int n_doc_txt_ptr;

    for (n_doc = 0;n_doc < gen_nb_xmlDocPtr;n_doc++) {
    for (n_nodes = 0;n_nodes < gen_nb_xmlNodeSetPtr;n_nodes++) {
    for (n_mode = 0;n_mode < gen_nb_int;n_mode++) {
    for (n_inclusive_ns_prefixes = 0;n_inclusive_ns_prefixes < gen_nb_xmlChar_ptr_ptr;n_inclusive_ns_prefixes++) {
    for (n_with_comments = 0;n_with_comments < gen_nb_int;n_with_comments++) {
    for (n_doc_txt_ptr = 0;n_doc_txt_ptr < gen_nb_xmlChar_ptr_ptr;n_doc_txt_ptr++) {
        mem_base = xmlMemBlocks();
        doc = gen_xmlDocPtr(n_doc, 0);
        nodes = gen_xmlNodeSetPtr(n_nodes, 1);
        mode = gen_int(n_mode, 2);
        inclusive_ns_prefixes = gen_xmlChar_ptr_ptr(n_inclusive_ns_prefixes, 3);
        with_comments = gen_int(n_with_comments, 4);
        doc_txt_ptr = gen_xmlChar_ptr_ptr(n_doc_txt_ptr, 5);

        ret_val = xmlC14NDocDumpMemory(doc, nodes, mode, inclusive_ns_prefixes, with_comments, doc_txt_ptr);
        desret_int(ret_val);
        call_tests++;
        des_xmlDocPtr(n_doc, doc, 0);
        des_xmlNodeSetPtr(n_nodes, nodes, 1);
        des_int(n_mode, mode, 2);
        des_xmlChar_ptr_ptr(n_inclusive_ns_prefixes, inclusive_ns_prefixes, 3);
        des_int(n_with_comments, with_comments, 4);
        des_xmlChar_ptr_ptr(n_doc_txt_ptr, doc_txt_ptr, 5);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlC14NDocDumpMemory",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_doc);
            printf(" %d", n_nodes);
            printf(" %d", n_mode);
            printf(" %d", n_inclusive_ns_prefixes);
            printf(" %d", n_with_comments);
            printf(" %d", n_doc_txt_ptr);
            printf("\n");
        }
    }
    }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}